

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O1

void __thiscall
QGraphicsWidgetPrivate::windowFrameMouseReleaseEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  undefined1 *puVar1;
  WindowFrameSection WVar2;
  QGraphicsItem *pQVar3;
  WindowData *pWVar4;
  QMarginsF *pQVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  QFlagsStorage<Qt::MouseButton> QVar9;
  QStyle *pQVar10;
  QWidget *pQVar11;
  ulong uVar12;
  QGraphicsItem *this_00;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  QPointF QVar18;
  double local_e8;
  double dStack_e0;
  ulong local_d0;
  QRectF local_c8;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_QGraphicsItemPrivate).q_ptr;
  this_00 = pQVar3 + -1;
  if (pQVar3 == (QGraphicsItem *)0x0) {
    this_00 = (QGraphicsItem *)0x0;
  }
  ensureWindowData(this);
  pWVar4 = (this->windowData)._M_t.
           super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           ._M_t.
           super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
  WVar2 = pWVar4->grabbedSection;
  if (WVar2 != NoSection) {
    if (WVar2 == TitleBarArea) {
      puVar1 = &pWVar4->field_0x20;
      *puVar1 = *puVar1 & 0xfd;
      local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)local_a8);
      initStyleOptionTitleBar(this,(QStyleOptionTitleBar *)local_a8);
      QGraphicsWidget::windowFrameRect(&local_c8,(QGraphicsWidget *)this_00);
      dVar15 = (double)((ulong)local_c8.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_c8.xp;
      dVar16 = 2147483647.0;
      if (dVar15 <= 2147483647.0) {
        dVar16 = dVar15;
      }
      if (dVar16 <= -2147483648.0) {
        dVar16 = -2147483648.0;
      }
      dVar17 = (double)((ulong)local_c8.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_c8.yp;
      dVar15 = 2147483647.0;
      if (dVar17 <= 2147483647.0) {
        dVar15 = dVar17;
      }
      if (dVar15 <= -2147483648.0) {
        dVar15 = -2147483648.0;
      }
      dVar17 = (local_c8.xp - (double)(int)dVar16) * 0.5 + local_c8.w;
      dVar17 = (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
      dVar16 = 2147483647.0;
      if (dVar17 <= 2147483647.0) {
        dVar16 = dVar17;
      }
      if (dVar16 <= -2147483648.0) {
        dVar16 = -2147483648.0;
      }
      dVar17 = (local_c8.yp - (double)(int)dVar15) * 0.5 + local_c8.h;
      dVar17 = (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
      dVar15 = 2147483647.0;
      if (dVar17 <= 2147483647.0) {
        dVar15 = dVar17;
      }
      if (dVar15 <= -2147483648.0) {
        dVar15 = -2147483648.0;
      }
      uStack_90._4_4_ = (int)dVar15 + -1;
      uStack_90._0_4_ = (int)dVar16 + -1;
      local_98._0_4_ = 0;
      local_98._4_4_ = 0;
      pQVar10 = QGraphicsWidget::style((QGraphicsWidget *)this_00);
      iVar7 = (**(code **)(*(long *)pQVar10 + 0xe0))
                        (pQVar10,0x1a,(QStyleOptionTitleBar *)local_a8,0);
      uStack_90._4_4_ = iVar7 + local_98._4_4_ + -1;
      QVar18 = QGraphicsSceneMouseEvent::pos(event);
      dVar16 = QVar18.yp;
      pQVar5 = (this->windowFrameMargins)._M_t.
               super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
               super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
               super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl;
      if (pQVar5 != (QMarginsF *)0x0) {
        QVar18.xp = QVar18.xp + pQVar5->m_left;
        QVar18.yp = dVar16 + pQVar5->m_top;
      }
      local_68 = (undefined1 *)
                 CONCAT44(local_68._4_4_,(QFlagsStorageHelper<QStyle::SubControl,_4>)0x8);
      pQVar10 = QGraphicsWidget::style((QGraphicsWidget *)this_00);
      pQVar11 = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
      local_c8._0_16_ = (**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,5,local_a8,8,pQVar11);
      local_e8 = QVar18.xp;
      dStack_e0 = QVar18.yp;
      auVar14._0_8_ = (double)((ulong)local_e8 & 0x8000000000000000 | 0x3fe0000000000000) + local_e8
      ;
      auVar14._8_8_ =
           (double)((ulong)dStack_e0 & 0x8000000000000000 | 0x3fe0000000000000) + dStack_e0;
      auVar14 = minpd(_DAT_0066f5d0,auVar14);
      auVar13._8_8_ = -(ulong)(-2147483648.0 < auVar14._8_8_);
      auVar13._0_8_ = -(ulong)(-2147483648.0 < auVar14._0_8_);
      uVar8 = movmskpd(local_c8.xp._0_4_,auVar13);
      uVar12 = 0x8000000000000000;
      if ((uVar8 & 2) != 0) {
        uVar12 = (ulong)(uint)(int)auVar14._8_8_ << 0x20;
      }
      local_d0 = 0x80000000;
      if ((uVar8 & 1) != 0) {
        local_d0 = (ulong)(uint)(int)auVar14._0_8_;
      }
      local_d0 = local_d0 | uVar12;
      iVar7 = (int)&local_d0;
      cVar6 = QRect::contains((QPoint *)&local_c8,SUB81(&local_d0,0));
      if (cVar6 != '\0') {
        QGraphicsWidget::close((QGraphicsWidget *)this_00,iVar7);
      }
      QIcon::~QIcon(&local_48);
      if (pQStack_60 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_60,2,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_a8);
    }
    QVar9.i = (Int)QGraphicsSceneMouseEvent::buttons(event);
    if ((QFlagsStorage<Qt::MouseButton>)QVar9.i == (QFlagsStorage<Qt::MouseButton>)0x0) {
      ((this->windowData)._M_t.
       super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
       ._M_t.
       super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
       .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl)->
      grabbedSection = NoSection;
    }
    (event->super_QGraphicsSceneEvent).field_0xc = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameMouseReleaseEvent(QGraphicsSceneMouseEvent *event)
{
    Q_Q(QGraphicsWidget);
    ensureWindowData();
    if (windowData->grabbedSection != Qt::NoSection) {
        if (windowData->grabbedSection == Qt::TitleBarArea) {
            windowData->buttonSunken = false;
            QStyleOptionTitleBar bar;
            initStyleOptionTitleBar(&bar);
            // make sure that the coordinates (rect and pos) we send to the style are positive.
            bar.rect = q->windowFrameRect().toRect();
            bar.rect.moveTo(0,0);
            bar.rect.setHeight(q->style()->pixelMetric(QStyle::PM_TitleBarHeight, &bar));
            QPointF pos = event->pos();
            if (windowFrameMargins) {
                pos.rx() += windowFrameMargins->left();
                pos.ry() += windowFrameMargins->top();
            }
            bar.subControls = QStyle::SC_TitleBarCloseButton;
            if (q->style()->subControlRect(QStyle::CC_TitleBar, &bar,
                                           QStyle::SC_TitleBarCloseButton,
                                           event->widget()).contains(pos.toPoint())) {
                q->close();
            }
        }
        if (!(static_cast<QGraphicsSceneMouseEvent *>(event)->buttons()))
            windowData->grabbedSection = Qt::NoSection;
        event->accept();
    }
}